

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD3Loader.cpp
# Opt level: O0

void __thiscall
Assimp::MD3Importer::InternReadFile
          (MD3Importer *this,string *pFile,aiScene *pScene,IOSystem *pIOHandler)

{
  size_t *psVar1;
  float fVar2;
  ai_real aVar3;
  ai_real aVar4;
  ai_real aVar5;
  iterator iVar6;
  Tag *pTVar7;
  size_type this_00;
  aiScene *pFile_00;
  bool bVar8;
  int iVar9;
  uint uVar10;
  reference pcVar11;
  IOStream *__p;
  pointer pIVar12;
  DeadlyImportError *pDVar13;
  reference pvVar14;
  pointer pbVar15;
  char *pcVar16;
  reference pSVar17;
  reference out;
  aiMesh *this_01;
  reference pTVar18;
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> *pbVar19;
  basic_formatter *pbVar20;
  long lVar21;
  Logger *pLVar22;
  aiMaterial *this_02;
  ulong *puVar23;
  ulong uVar24;
  aiVector3t<float> *paVar25;
  void *pvVar26;
  reference pTVar27;
  aiNode *paVar28;
  float *pfVar29;
  aiFace *paVar30;
  aiVector3t<float> *local_1238;
  aiVector3t<float> *local_1210;
  aiVector3t<float> *local_11e8;
  aiFace *local_11c0;
  aiMatrix4x4t<float> local_1034;
  uint local_ff4;
  uint local_ff0;
  uint i_2;
  uint m;
  uint a;
  aiNode *nd;
  uint i_1;
  undefined1 local_fb2;
  allocator<char> local_fb1;
  string local_fb0;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_f90;
  string local_e18;
  iterator local_df8;
  _List_const_iterator<Assimp::Q3Shader::SkinData::TextureEntry> local_df0;
  iterator local_de8;
  _List_const_iterator<Assimp::Q3Shader::SkinData::TextureEntry> local_de0;
  const_iterator it_2;
  aiVector3D *nor;
  string local_dc8;
  ai_real local_da4;
  float *pfStack_da0;
  uint32_t index;
  aiVector3D *vec;
  ai_real local_d90;
  uint c;
  uint i;
  uint iCurrent;
  int no_alpha;
  aiString szString;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_960;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_940;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_920;
  undefined1 local_8fc [8];
  aiString name;
  aiColor3D clr;
  int iMode;
  aiMaterial *pcHelper;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c0;
  iterator local_4a0;
  _List_const_iterator<Assimp::Q3Shader::ShaderDataBlock> local_498;
  _List_node_base *local_490;
  _List_iterator<Assimp::Q3Shader::ShaderDataBlock> local_488;
  iterator local_480;
  _List_const_iterator<Assimp::Q3Shader::ShaderDataBlock> local_478;
  const_iterator dit_1;
  string without_ext;
  size_type sh;
  ShaderDataBlock *shader;
  string convertedPath;
  string local_2a8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_288;
  _Self local_280;
  _List_node_base *local_278;
  _List_iterator<Assimp::Q3Shader::SkinData::TextureEntry> local_270;
  _Self local_268;
  iterator it_1;
  char *texture_name;
  string _texture_name;
  aiMesh *pcMesh;
  Shader *pcShaders;
  TexCoord *pcUVs;
  Triangle *pcTriangles;
  Vertex *pcVertices;
  uint iNumMaterials;
  uint iNum;
  _Self local_200;
  iterator mit;
  _Self local_1f0;
  iterator dit;
  char *header_name;
  ShaderData shaders;
  SkinData skins;
  string local_1a8;
  undefined1 local_182;
  allocator<char> local_181;
  string local_180;
  uchar *local_160;
  Tag *pcTags;
  Surface *pcSurfaces;
  undefined1 local_148 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> mBuffer2;
  string local_128;
  undefined1 local_101;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  allocator<char> local_b9;
  string local_b8;
  unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_> local_98;
  unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_> file;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_88;
  iterator it;
  string local_70 [32];
  string local_50 [32];
  long local_30;
  size_type s;
  IOSystem *pIOHandler_local;
  aiScene *pScene_local;
  string *pFile_local;
  MD3Importer *this_local;
  
  s = (size_type)pIOHandler;
  pIOHandler_local = (IOSystem *)pScene;
  pScene_local = (aiScene *)pFile;
  pFile_local = (string *)this;
  std::__cxx11::string::operator=((string *)&this->mFile,(string *)pFile);
  this->mScene = (aiScene *)pIOHandler_local;
  this->mIOHandler = (IOSystem *)s;
  local_30 = std::__cxx11::string::find_last_of((char *)&this->mFile,0xc7ae84);
  if (local_30 == -1) {
    local_30 = 0;
  }
  else {
    local_30 = local_30 + 1;
  }
  std::__cxx11::string::substr((ulong)local_50,(ulong)&this->mFile);
  std::__cxx11::string::operator=((string *)&this->filename,local_50);
  std::__cxx11::string::substr((ulong)local_70,(ulong)&this->mFile);
  std::__cxx11::string::operator=((string *)&this->path,local_70);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string(local_50);
  local_88._M_current = (char *)std::__cxx11::string::begin();
  while( true ) {
    file._M_t.super___uniq_ptr_impl<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>._M_t.
    super__Tuple_impl<0UL,_Assimp::IOStream_*,_std::default_delete<Assimp::IOStream>_>.
    super__Head_base<0UL,_Assimp::IOStream_*,_false>._M_head_impl =
         (__uniq_ptr_data<Assimp::IOStream,_std::default_delete<Assimp::IOStream>,_true,_true>)
         std::__cxx11::string::end();
    bVar8 = __gnu_cxx::operator!=
                      (&local_88,
                       (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&file);
    if (!bVar8) break;
    pcVar11 = __gnu_cxx::
              __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator*(&local_88);
    iVar9 = tolower((int)*pcVar11);
    pcVar11 = __gnu_cxx::
              __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator*(&local_88);
    *pcVar11 = (char)iVar9;
    __gnu_cxx::
    __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&local_88);
  }
  if (((this->configHandleMP & 1U) == 0) || (bVar8 = ReadMultipartFile(this), !bVar8)) {
    pFile_00 = pScene_local;
    this_00 = s;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"rb",&local_b9);
    __p = IOSystem::Open((IOSystem *)this_00,(string *)pFile_00,&local_b8);
    std::unique_ptr<Assimp::IOStream,std::default_delete<Assimp::IOStream>>::
    unique_ptr<std::default_delete<Assimp::IOStream>,void>
              ((unique_ptr<Assimp::IOStream,std::default_delete<Assimp::IOStream>> *)&local_98,__p);
    std::__cxx11::string::~string((string *)&local_b8);
    std::allocator<char>::~allocator(&local_b9);
    pIVar12 = std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::get
                        (&local_98);
    if (pIVar12 == (pointer)0x0) {
      local_101 = 1;
      pDVar13 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      std::operator+(&local_100,"Failed to open MD3 file ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     pScene_local);
      std::operator+(&local_e0,&local_100,".");
      DeadlyImportError::DeadlyImportError(pDVar13,&local_e0);
      local_101 = 0;
      __cxa_throw(pDVar13,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
    }
    pIVar12 = std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::operator->
                        (&local_98);
    uVar10 = (*pIVar12->_vptr_IOStream[6])();
    this->fileSize = uVar10;
    if (this->fileSize < 0x6c) {
      mBuffer2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
      pDVar13 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_128,"MD3 File is too small.",
                 (allocator<char> *)
                 ((long)&mBuffer2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      DeadlyImportError::DeadlyImportError(pDVar13,&local_128);
      mBuffer2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
      __cxa_throw(pDVar13,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
    }
    uVar10 = this->fileSize;
    std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)((long)&pcSurfaces + 7));
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_148,(ulong)uVar10,
               (allocator<unsigned_char> *)((long)&pcSurfaces + 7));
    std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)((long)&pcSurfaces + 7));
    pIVar12 = std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::operator->
                        (&local_98);
    pvVar14 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_148,0);
    (*pIVar12->_vptr_IOStream[2])(pIVar12,pvVar14,1,(ulong)this->fileSize);
    pvVar14 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_148,0);
    this->mBuffer = pvVar14;
    this->pcHeader = (Header *)this->mBuffer;
    ValidateHeaderOffsets(this);
    pcTags = (Tag *)(this->mBuffer + this->pcHeader->OFS_SURFACES);
    local_160 = this->mBuffer + this->pcHeader->OFS_TAGS;
    *(uint32_t *)
     &(pIOHandler_local->m_pathStack).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = this->pcHeader->NUM_SURFACES;
    if (this->pcHeader->NUM_SURFACES == 0) {
      local_182 = 1;
      pDVar13 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_180,"MD3: No surfaces",&local_181);
      DeadlyImportError::DeadlyImportError(pDVar13,&local_180);
      local_182 = 0;
      __cxa_throw(pDVar13,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
    }
    if (0x31f38 < this->pcHeader->NUM_SURFACES) {
      skins.textures.
      super__List_base<Assimp::Q3Shader::SkinData::TextureEntry,_std::allocator<Assimp::Q3Shader::SkinData::TextureEntry>_>
      ._M_impl._M_node._M_size._6_1_ = 1;
      pDVar13 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1a8,"MD3: Too many surfaces, would run out of memory",
                 (allocator<char> *)
                 ((long)&skins.textures.
                         super__List_base<Assimp::Q3Shader::SkinData::TextureEntry,_std::allocator<Assimp::Q3Shader::SkinData::TextureEntry>_>
                         ._M_impl._M_node._M_size + 7));
      DeadlyImportError::DeadlyImportError(pDVar13,&local_1a8);
      skins.textures.
      super__List_base<Assimp::Q3Shader::SkinData::TextureEntry,_std::allocator<Assimp::Q3Shader::SkinData::TextureEntry>_>
      ._M_impl._M_node._M_size._6_1_ = 0;
      __cxa_throw(pDVar13,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
    }
    pbVar15 = (pointer)operator_new__((ulong)*(uint *)&(pIOHandler_local->m_pathStack).
                                                                                                              
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish << 3);
    (pIOHandler_local->m_pathStack).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = pbVar15;
    *(uint32_t *)&pIOHandler_local[1]._vptr_IOSystem = this->pcHeader->NUM_SURFACES;
    pbVar15 = (pointer)operator_new__((ulong)*(uint *)&(pIOHandler_local->m_pathStack).
                                                                                                              
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish << 3);
    pIOHandler_local[1].m_pathStack.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = pbVar15;
    memset((pIOHandler_local->m_pathStack).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage,0,
           (ulong)*(uint *)&(pIOHandler_local->m_pathStack).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish << 3);
    memset(pIOHandler_local[1].m_pathStack.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start,0,
           (ulong)*(uint *)&pIOHandler_local[1]._vptr_IOSystem << 3);
    psVar1 = &shaders.blocks.
              super__List_base<Assimp::Q3Shader::ShaderDataBlock,_std::allocator<Assimp::Q3Shader::ShaderDataBlock>_>
              ._M_impl._M_node._M_size;
    Q3Shader::SkinData::SkinData((SkinData *)psVar1);
    ReadSkin(this,(SkinData *)psVar1);
    Q3Shader::ShaderData::ShaderData((ShaderData *)&header_name);
    ReadShader(this,(ShaderData *)&header_name);
    dit._M_node = (_List_node_base *)this->pcHeader->NAME;
    bVar8 = std::__cxx11::
            list<Assimp::Q3Shader::ShaderDataBlock,_std::allocator<Assimp::Q3Shader::ShaderDataBlock>_>
            ::empty((list<Assimp::Q3Shader::ShaderDataBlock,_std::allocator<Assimp::Q3Shader::ShaderDataBlock>_>
                     *)&header_name);
    if (!bVar8) {
      local_1f0._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<Assimp::Q3Shader::ShaderDataBlock,_std::allocator<Assimp::Q3Shader::ShaderDataBlock>_>
           ::begin((list<Assimp::Q3Shader::ShaderDataBlock,_std::allocator<Assimp::Q3Shader::ShaderDataBlock>_>
                    *)&header_name);
      while( true ) {
        mit._M_node = (_List_node_base *)
                      std::__cxx11::
                      list<Assimp::Q3Shader::ShaderDataBlock,_std::allocator<Assimp::Q3Shader::ShaderDataBlock>_>
                      ::end((list<Assimp::Q3Shader::ShaderDataBlock,_std::allocator<Assimp::Q3Shader::ShaderDataBlock>_>
                             *)&header_name);
        bVar8 = std::operator!=(&local_1f0,(_Self *)&mit);
        if (!bVar8) break;
        std::_List_iterator<Assimp::Q3Shader::ShaderDataBlock>::operator*(&local_1f0);
        pcVar16 = (char *)std::__cxx11::string::c_str();
        iVar6 = dit;
        pSVar17 = std::_List_iterator<Assimp::Q3Shader::ShaderDataBlock>::operator*(&local_1f0);
        ConvertPath(this,pcVar16,(char *)iVar6._M_node,&pSVar17->name);
        pSVar17 = std::_List_iterator<Assimp::Q3Shader::ShaderDataBlock>::operator*(&local_1f0);
        local_200._M_node =
             (_List_node_base *)
             std::__cxx11::
             list<Assimp::Q3Shader::ShaderMapBlock,_std::allocator<Assimp::Q3Shader::ShaderMapBlock>_>
             ::begin(&pSVar17->maps);
        while( true ) {
          pSVar17 = std::_List_iterator<Assimp::Q3Shader::ShaderDataBlock>::operator*(&local_1f0);
          _iNumMaterials =
               std::__cxx11::
               list<Assimp::Q3Shader::ShaderMapBlock,_std::allocator<Assimp::Q3Shader::ShaderMapBlock>_>
               ::end(&pSVar17->maps);
          bVar8 = std::operator!=(&local_200,(_Self *)&iNumMaterials);
          if (!bVar8) break;
          std::_List_iterator<Assimp::Q3Shader::ShaderMapBlock>::operator*(&local_200);
          pcVar16 = (char *)std::__cxx11::string::c_str();
          iVar6 = dit;
          out = std::_List_iterator<Assimp::Q3Shader::ShaderMapBlock>::operator*(&local_200);
          ConvertPath(this,pcVar16,(char *)iVar6._M_node,&out->name);
          std::_List_iterator<Assimp::Q3Shader::ShaderMapBlock>::operator++(&local_200);
        }
        std::_List_iterator<Assimp::Q3Shader::ShaderDataBlock>::operator++(&local_1f0);
      }
    }
    pcVertices._0_4_ = 0;
    pcVertices._4_4_ = this->pcHeader->NUM_SURFACES;
    while (uVar10 = pcVertices._4_4_ - 1, pcVertices._4_4_ != 0) {
      ValidateSurfaceHeaderOffsets(this,(Surface *)pcTags);
      pTVar7 = pcTags;
      aVar3 = pcTags->orientation[2][0];
      pcUVs = (TexCoord *)(pcTags->NAME + (uint)pcTags->orientation[1][0]);
      aVar4 = pcTags->orientation[1][2];
      aVar5 = pcTags->orientation[1][1];
      pcVar16 = pcTags->NAME;
      pcVertices._4_4_ = uVar10;
      if ((pcTags->orientation[0][1] == 0.0) || (pcTags->orientation[0][2] == 0.0)) {
        pcTags = (Tag *)(pcTags->NAME + (int)pcTags->orientation[2][1]);
        *(int *)&(pIOHandler_local->m_pathStack).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish =
             *(int *)&(pIOHandler_local->m_pathStack).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish + -1;
      }
      else {
        this_01 = (aiMesh *)operator_new(0x520);
        aiMesh::aiMesh(this_01);
        *(aiMesh **)
         (&((pIOHandler_local->m_pathStack).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage)->_M_dataplus + (ulong)uVar10 * 8) =
             this_01;
        _texture_name.field_2._8_8_ =
             *(undefined8 *)
              (&((pIOHandler_local->m_pathStack).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage)->_M_dataplus +
              (ulong)uVar10 * 8);
        std::__cxx11::string::string((string *)&texture_name);
        it_1._M_node = (_List_node_base *)0x0;
        psVar1 = &shaders.blocks.
                  super__List_base<Assimp::Q3Shader::ShaderDataBlock,_std::allocator<Assimp::Q3Shader::ShaderDataBlock>_>
                  ._M_impl._M_node._M_size;
        local_270._M_node =
             (_List_node_base *)
             std::__cxx11::
             list<Assimp::Q3Shader::SkinData::TextureEntry,_std::allocator<Assimp::Q3Shader::SkinData::TextureEntry>_>
             ::begin((list<Assimp::Q3Shader::SkinData::TextureEntry,_std::allocator<Assimp::Q3Shader::SkinData::TextureEntry>_>
                      *)psVar1);
        local_278 = (_List_node_base *)
                    std::__cxx11::
                    list<Assimp::Q3Shader::SkinData::TextureEntry,_std::allocator<Assimp::Q3Shader::SkinData::TextureEntry>_>
                    ::end((list<Assimp::Q3Shader::SkinData::TextureEntry,_std::allocator<Assimp::Q3Shader::SkinData::TextureEntry>_>
                           *)psVar1);
        local_268._M_node =
             (_List_node_base *)
             std::find<std::_List_iterator<Assimp::Q3Shader::SkinData::TextureEntry>,char[64]>
                       (local_270,
                        (_List_iterator<Assimp::Q3Shader::SkinData::TextureEntry>)local_278,
                        (char (*) [64])(pcTags->NAME + 4));
        local_280._M_node =
             (_List_node_base *)
             std::__cxx11::
             list<Assimp::Q3Shader::SkinData::TextureEntry,_std::allocator<Assimp::Q3Shader::SkinData::TextureEntry>_>
             ::end((list<Assimp::Q3Shader::SkinData::TextureEntry,_std::allocator<Assimp::Q3Shader::SkinData::TextureEntry>_>
                    *)&shaders.blocks.
                       super__List_base<Assimp::Q3Shader::ShaderDataBlock,_std::allocator<Assimp::Q3Shader::ShaderDataBlock>_>
                       ._M_impl._M_node._M_size);
        bVar8 = std::operator!=(&local_268,&local_280);
        if (bVar8) {
          pTVar18 = std::_List_iterator<Assimp::Q3Shader::SkinData::TextureEntry>::operator*
                              (&local_268);
          std::__cxx11::string::operator=
                    ((string *)&texture_name,
                     (string *)
                     &(pTVar18->
                      super_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ).second);
          local_288._M_current = (char *)std::__cxx11::string::begin();
          it_1._M_node = (_List_node_base *)
                         __gnu_cxx::
                         __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         ::operator*(&local_288);
          pLVar22 = DefaultLogger::get();
          Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
          basic_formatter<char[29]>
                    ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&convertedPath.field_2 + 8),
                     (char (*) [29])"MD3: Assigning skin texture ");
          pTVar18 = std::_List_iterator<Assimp::Q3Shader::SkinData::TextureEntry>::operator*
                              (&local_268);
          pbVar19 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                    Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                    operator_((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                              (convertedPath.field_2._M_local_buf + 8),
                              &(pTVar18->
                               super_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               ).second);
          pbVar19 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                    Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                    operator_(pbVar19,(char (*) [13])" to surface ");
          pbVar20 = (basic_formatter *)
                    Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                    operator_(pbVar19,(char (*) [64])(pcTags->NAME + 4));
          Formatter::basic_formatter::operator_cast_to_string(&local_2a8,pbVar20);
          Logger::debug(pLVar22,&local_2a8);
          std::__cxx11::string::~string((string *)&local_2a8);
          Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
          ~basic_formatter((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&convertedPath.field_2 + 8));
          pTVar18 = std::_List_iterator<Assimp::Q3Shader::SkinData::TextureEntry>::operator*
                              (&local_268);
          pTVar18->resolved = true;
        }
        if ((it_1._M_node == (_List_node_base *)0x0) && (pcTags->orientation[0][0] != 0.0)) {
          it_1._M_node = (_List_node_base *)(pcVar16 + (uint)aVar5);
        }
        std::__cxx11::string::string((string *)&shader);
        if (it_1._M_node != (_List_node_base *)0x0) {
          ConvertPath(this,(char *)it_1._M_node,(char *)dit._M_node,(string *)&shader);
        }
        sh = 0;
        bVar8 = std::__cxx11::
                list<Assimp::Q3Shader::ShaderDataBlock,_std::allocator<Assimp::Q3Shader::ShaderDataBlock>_>
                ::empty((list<Assimp::Q3Shader::ShaderDataBlock,_std::allocator<Assimp::Q3Shader::ShaderDataBlock>_>
                         *)&header_name);
        if (!bVar8) {
          lVar21 = std::__cxx11::string::find_last_of((char)&shader,0x2e);
          if (lVar21 == -1) {
            std::__cxx11::string::length();
          }
          std::__cxx11::string::substr((ulong)&dit_1,(ulong)&shader);
          local_488._M_node =
               (_List_node_base *)
               std::__cxx11::
               list<Assimp::Q3Shader::ShaderDataBlock,_std::allocator<Assimp::Q3Shader::ShaderDataBlock>_>
               ::begin((list<Assimp::Q3Shader::ShaderDataBlock,_std::allocator<Assimp::Q3Shader::ShaderDataBlock>_>
                        *)&header_name);
          local_490 = (_List_node_base *)
                      std::__cxx11::
                      list<Assimp::Q3Shader::ShaderDataBlock,_std::allocator<Assimp::Q3Shader::ShaderDataBlock>_>
                      ::end((list<Assimp::Q3Shader::ShaderDataBlock,_std::allocator<Assimp::Q3Shader::ShaderDataBlock>_>
                             *)&header_name);
          local_480._M_node =
               (_List_node_base *)
               std::
               find<std::_List_iterator<Assimp::Q3Shader::ShaderDataBlock>,std::__cxx11::string>
                         (local_488,(_List_iterator<Assimp::Q3Shader::ShaderDataBlock>)local_490,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &dit_1);
          std::_List_const_iterator<Assimp::Q3Shader::ShaderDataBlock>::_List_const_iterator
                    (&local_478,&local_480);
          local_4a0._M_node =
               (_List_node_base *)
               std::__cxx11::
               list<Assimp::Q3Shader::ShaderDataBlock,_std::allocator<Assimp::Q3Shader::ShaderDataBlock>_>
               ::end((list<Assimp::Q3Shader::ShaderDataBlock,_std::allocator<Assimp::Q3Shader::ShaderDataBlock>_>
                      *)&header_name);
          std::_List_const_iterator<Assimp::Q3Shader::ShaderDataBlock>::_List_const_iterator
                    (&local_498,&local_4a0);
          bVar8 = std::operator!=(&local_478,&local_498);
          if (bVar8) {
            sh = (size_type)
                 std::_List_const_iterator<Assimp::Q3Shader::ShaderDataBlock>::operator*(&local_478)
            ;
            pLVar22 = DefaultLogger::get();
            std::operator+(&local_4c0,"Found shader record for ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &dit_1);
            Logger::info(pLVar22,&local_4c0);
            std::__cxx11::string::~string((string *)&local_4c0);
          }
          else {
            pLVar22 = DefaultLogger::get();
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &pcHelper,"Unable to find shader record for ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &dit_1);
            Logger::warn(pLVar22,(string *)&pcHelper);
            std::__cxx11::string::~string((string *)&pcHelper);
          }
          std::__cxx11::string::~string((string *)&dit_1);
        }
        this_02 = (aiMaterial *)operator_new(0x10);
        aiMaterial::aiMaterial(this_02);
        clr.g = 2.8026e-45;
        unique0x100026c4 = this_02;
        aiMaterial::AddProperty<int>(this_02,(int *)&clr.g,1,"$mat.shadingm",0,0);
        aiColor3D::aiColor3D((aiColor3D *)(name.data + 0x3f8));
        name.data[0x3f8] = -0x33;
        name.data[0x3f9] = -0x34;
        name.data[0x3fa] = 'L';
        name.data[0x3fb] = '=';
        name.data[0x3fc] = -0x33;
        name.data[0x3fd] = -0x34;
        name.data[0x3fe] = 'L';
        name.data[0x3ff] = '=';
        clr.r = 0.05;
        aiMaterial::AddProperty<aiColor3D>
                  (stack0xfffffffffffffb18,(aiColor3D *)(name.data + 0x3f8),1,"$clr.ambient",0,0);
        name.data[0x3f8] = '\0';
        name.data[0x3f9] = '\0';
        name.data[0x3fa] = -0x80;
        name.data[0x3fb] = '?';
        name.data[0x3fc] = '\0';
        name.data[0x3fd] = '\0';
        name.data[0x3fe] = -0x80;
        name.data[0x3ff] = '?';
        clr.r = 1.0;
        aiMaterial::AddProperty<aiColor3D>
                  (stack0xfffffffffffffb18,(aiColor3D *)(name.data + 0x3f8),1,"$clr.diffuse",0,0);
        aiMaterial::AddProperty<aiColor3D>
                  (stack0xfffffffffffffb18,(aiColor3D *)(name.data + 0x3f8),1,"$clr.specular",0,0);
        aiString::aiString((aiString *)local_8fc);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (szString.data + 0x3f8),"MD3_[",&this->configSkinFile);
        std::operator+(&local_960,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (szString.data + 0x3f8),"][");
        std::operator+(&local_940,&local_960,pcTags->NAME + 4);
        std::operator+(&local_920,&local_940,"]");
        aiString::Set((aiString *)local_8fc,&local_920);
        std::__cxx11::string::~string((string *)&local_920);
        std::__cxx11::string::~string((string *)&local_940);
        std::__cxx11::string::~string((string *)&local_960);
        std::__cxx11::string::~string((string *)(szString.data + 0x3f8));
        aiMaterial::AddProperty(stack0xfffffffffffffb18,(aiString *)local_8fc,"?mat.name",0,0);
        if (sh == 0) {
          aiString::aiString((aiString *)&iCurrent);
          lVar21 = std::__cxx11::string::length();
          if (lVar21 == 0) {
            pLVar22 = DefaultLogger::get();
            Logger::warn(pLVar22,"Texture file name has zero length. Using default name");
            aiString::Set((aiString *)&iCurrent,"dummy_texture.bmp");
          }
          else {
            aiString::Set((aiString *)&iCurrent,(string *)&shader);
          }
          aiMaterial::AddProperty(stack0xfffffffffffffb18,(aiString *)&iCurrent,"$tex.file",1,0);
          i = 4;
          aiMaterial::AddProperty(stack0xfffffffffffffb18,(int *)&i,1,"$tex.flags",1,0);
        }
        else {
          Q3Shader::ConvertShaderToMaterial(stack0xfffffffffffffb18,(ShaderDataBlock *)sh);
        }
        *(aiMaterial **)
         (&(pIOHandler_local[1].m_pathStack.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus + (ulong)(uint)pcVertices * 8) =
             stack0xfffffffffffffb18;
        *(uint *)(_texture_name.field_2._8_8_ + 0xe8) = (uint)pcVertices;
        *(undefined4 *)_texture_name.field_2._8_8_ = 4;
        *(int *)(_texture_name.field_2._8_8_ + 4) = (int)pcTags->orientation[0][2] * 3;
        *(ai_real *)(_texture_name.field_2._8_8_ + 8) = pcTags->orientation[0][2];
        uVar24 = (ulong)(uint)pcTags->orientation[0][2];
        puVar23 = (ulong *)operator_new__(uVar24 << 4 | 8);
        *puVar23 = uVar24;
        paVar30 = (aiFace *)(puVar23 + 1);
        if (uVar24 != 0) {
          local_11c0 = paVar30;
          do {
            aiFace::aiFace(local_11c0);
            local_11c0 = local_11c0 + 1;
          } while (local_11c0 != paVar30 + uVar24);
        }
        *(aiFace **)(_texture_name.field_2._8_8_ + 0xd0) = paVar30;
        uVar24 = (ulong)*(uint *)(_texture_name.field_2._8_8_ + 4);
        paVar25 = (aiVector3t<float> *)operator_new__(uVar24 * 0xc);
        if (uVar24 != 0) {
          local_11e8 = paVar25;
          do {
            aiVector3t<float>::aiVector3t(local_11e8);
            local_11e8 = local_11e8 + 1;
          } while (local_11e8 != paVar25 + uVar24);
        }
        *(aiVector3t<float> **)(_texture_name.field_2._8_8_ + 0x18) = paVar25;
        uVar24 = (ulong)*(uint *)(_texture_name.field_2._8_8_ + 4);
        paVar25 = (aiVector3t<float> *)operator_new__(uVar24 * 0xc);
        if (uVar24 != 0) {
          local_1210 = paVar25;
          do {
            aiVector3t<float>::aiVector3t(local_1210);
            local_1210 = local_1210 + 1;
          } while (local_1210 != paVar25 + uVar24);
        }
        *(aiVector3t<float> **)(_texture_name.field_2._8_8_ + 0x10) = paVar25;
        uVar24 = (ulong)*(uint *)(_texture_name.field_2._8_8_ + 4);
        paVar25 = (aiVector3t<float> *)operator_new__(uVar24 * 0xc);
        if (uVar24 != 0) {
          local_1238 = paVar25;
          do {
            aiVector3t<float>::aiVector3t(local_1238);
            local_1238 = local_1238 + 1;
          } while (local_1238 != paVar25 + uVar24);
        }
        *(aiVector3t<float> **)(_texture_name.field_2._8_8_ + 0x70) = paVar25;
        *(undefined4 *)(_texture_name.field_2._8_8_ + 0xb0) = 2;
        c = 0;
        for (local_d90 = 0.0; (uint)local_d90 < (uint)pcTags->orientation[0][2];
            local_d90 = (ai_real)((int)local_d90 + 1)) {
          pvVar26 = operator_new__(0xc);
          *(void **)(*(long *)(_texture_name.field_2._8_8_ + 0xd0) + (ulong)(uint)local_d90 * 0x10 +
                    8) = pvVar26;
          *(undefined4 *)
           (*(long *)(_texture_name.field_2._8_8_ + 0xd0) + (ulong)(uint)local_d90 * 0x10) = 3;
          for (vec._4_4_ = 0; vec._4_4_ < 3; vec._4_4_ = vec._4_4_ + 1) {
            *(uint *)(*(long *)(*(long *)(_texture_name.field_2._8_8_ + 0xd0) +
                                (ulong)(uint)local_d90 * 0x10 + 8) + (ulong)vec._4_4_ * 4) = c;
            pfStack_da0 = (float *)(*(long *)(_texture_name.field_2._8_8_ + 0x10) + (ulong)c * 0xc);
            local_da4 = (&pcUVs->U)[vec._4_4_];
            if ((uint)pcTags->orientation[0][1] <= (uint)local_da4) {
              nor._6_1_ = 1;
              pDVar13 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_dc8,"MD3: Invalid vertex index",
                         (allocator<char> *)((long)&nor + 7));
              DeadlyImportError::DeadlyImportError(pDVar13,&local_dc8);
              nor._6_1_ = 0;
              __cxa_throw(pDVar13,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError
                         );
            }
            *pfStack_da0 = (float)(int)*(short *)(pTVar7->NAME +
                                                 (ulong)(uint)local_da4 * 8 + (ulong)(uint)aVar3) *
                           0.015625;
            pfStack_da0[1] =
                 (float)(int)*(short *)(pTVar7->NAME +
                                       (ulong)(uint)local_da4 * 8 + (ulong)(uint)aVar3 + 2) *
                 0.015625;
            pfStack_da0[2] =
                 (float)(int)*(short *)(pTVar7->NAME +
                                       (ulong)(uint)local_da4 * 8 + (ulong)(uint)aVar3 + 4) *
                 0.015625;
            it_2._M_node = (_List_node_base *)
                           (*(long *)(_texture_name.field_2._8_8_ + 0x18) + (ulong)c * 0xc);
            MD3::LatLngNormalToVec3
                      (*(uint16_t *)
                        (pTVar7->NAME + (ulong)(uint)local_da4 * 8 + (ulong)(uint)aVar3 + 6),
                       (ai_real *)it_2._M_node);
            *(undefined4 *)(*(long *)(_texture_name.field_2._8_8_ + 0x70) + (ulong)c * 0xc) =
                 *(undefined4 *)(pTVar7->NAME + (ulong)(uint)local_da4 * 8 + (ulong)(uint)aVar4);
            *(float *)(*(long *)(_texture_name.field_2._8_8_ + 0x70) + (ulong)c * 0xc + 4) =
                 1.0 - *(float *)(pTVar7->NAME + (ulong)(uint)local_da4 * 8 + (ulong)(uint)aVar4 + 4
                                 );
            c = c + 1;
          }
          if ((sh == 0) || (*(int *)(sh + 0x20) == 1)) {
            std::swap<unsigned_int>
                      ((uint *)(*(long *)(*(long *)(_texture_name.field_2._8_8_ + 0xd0) +
                                          (ulong)(uint)local_d90 * 0x10 + 8) + 8),
                       (uint *)(*(long *)(*(long *)(_texture_name.field_2._8_8_ + 0xd0) +
                                          (ulong)(uint)local_d90 * 0x10 + 8) + 4));
          }
          pcUVs = (TexCoord *)&pcUVs[1].V;
        }
        pcTags = (Tag *)(pcTags->NAME + (int)pcTags->orientation[2][1]);
        std::__cxx11::string::~string((string *)&shader);
        std::__cxx11::string::~string((string *)&texture_name);
        pcVertices._0_4_ = (uint)pcVertices + 1;
      }
    }
    bVar8 = DefaultLogger::isNullLogger();
    if (!bVar8) {
      local_de8._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<Assimp::Q3Shader::SkinData::TextureEntry,_std::allocator<Assimp::Q3Shader::SkinData::TextureEntry>_>
           ::begin((list<Assimp::Q3Shader::SkinData::TextureEntry,_std::allocator<Assimp::Q3Shader::SkinData::TextureEntry>_>
                    *)&shaders.blocks.
                       super__List_base<Assimp::Q3Shader::ShaderDataBlock,_std::allocator<Assimp::Q3Shader::ShaderDataBlock>_>
                       ._M_impl._M_node._M_size);
      std::_List_const_iterator<Assimp::Q3Shader::SkinData::TextureEntry>::_List_const_iterator
                (&local_de0,&local_de8);
      while( true ) {
        local_df8._M_node =
             (_List_node_base *)
             std::__cxx11::
             list<Assimp::Q3Shader::SkinData::TextureEntry,_std::allocator<Assimp::Q3Shader::SkinData::TextureEntry>_>
             ::end((list<Assimp::Q3Shader::SkinData::TextureEntry,_std::allocator<Assimp::Q3Shader::SkinData::TextureEntry>_>
                    *)&shaders.blocks.
                       super__List_base<Assimp::Q3Shader::ShaderDataBlock,_std::allocator<Assimp::Q3Shader::ShaderDataBlock>_>
                       ._M_impl._M_node._M_size);
        std::_List_const_iterator<Assimp::Q3Shader::SkinData::TextureEntry>::_List_const_iterator
                  (&local_df0,&local_df8);
        bVar8 = std::operator!=(&local_de0,&local_df0);
        if (!bVar8) break;
        pTVar27 = std::_List_const_iterator<Assimp::Q3Shader::SkinData::TextureEntry>::operator*
                            (&local_de0);
        if ((pTVar27->resolved & 1U) == 0) {
          pLVar22 = DefaultLogger::get();
          Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
          basic_formatter<char[27]>(&local_f90,(char (*) [27])"MD3: Failed to match skin ");
          pTVar27 = std::_List_const_iterator<Assimp::Q3Shader::SkinData::TextureEntry>::operator*
                              (&local_de0);
          pbVar19 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                    Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                    operator_((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                              &local_f90,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              pTVar27);
          pbVar19 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                    Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                    operator_(pbVar19,(char (*) [13])" to surface ");
          pTVar27 = std::_List_const_iterator<Assimp::Q3Shader::SkinData::TextureEntry>::operator*
                              (&local_de0);
          pbVar20 = (basic_formatter *)
                    Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                    operator_(pbVar19,&(pTVar27->
                                       super_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                       ).second);
          Formatter::basic_formatter::operator_cast_to_string(&local_e18,pbVar20);
          Logger::error(pLVar22,&local_e18);
          std::__cxx11::string::~string((string *)&local_e18);
          Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
          ~basic_formatter(&local_f90);
        }
        std::_List_const_iterator<Assimp::Q3Shader::SkinData::TextureEntry>::operator++(&local_de0);
      }
    }
    if (*(int *)&(pIOHandler_local->m_pathStack).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish == 0) {
      local_fb2 = 1;
      pDVar13 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_fb0,"MD3: File contains no valid mesh",&local_fb1);
      DeadlyImportError::DeadlyImportError(pDVar13,&local_fb0);
      local_fb2 = 0;
      __cxa_throw(pDVar13,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
    }
    *(uint *)&pIOHandler_local[1]._vptr_IOSystem = (uint)pcVertices;
    paVar28 = (aiNode *)operator_new(0x478);
    nd._6_1_ = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&i_1,"<MD3Root>",(allocator<char> *)((long)&nd + 7));
    aiNode::aiNode(paVar28,(string *)&i_1);
    nd._6_1_ = 0;
    (pIOHandler_local->m_pathStack).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)paVar28;
    std::__cxx11::string::~string((string *)&i_1);
    std::allocator<char>::~allocator((allocator<char> *)((long)&nd + 7));
    *(undefined4 *)
     ((pIOHandler_local->m_pathStack).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start + 0x23) =
         *(undefined4 *)
          &(pIOHandler_local->m_pathStack).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
    pvVar26 = operator_new__((ulong)*(uint *)&(pIOHandler_local->m_pathStack).
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_finish << 2);
    (pIOHandler_local->m_pathStack).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start[0x23]._M_string_length = (size_type)pvVar26;
    if (this->pcHeader->NUM_TAGS != 0) {
      *(uint32_t *)
       &(pIOHandler_local->m_pathStack).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[0x22].field_2 = this->pcHeader->NUM_TAGS;
      pvVar26 = operator_new__((ulong)this->pcHeader->NUM_TAGS << 3);
      *(void **)((long)&(pIOHandler_local->m_pathStack).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[0x22].field_2 + 8) = pvVar26;
      for (nd._0_4_ = 0; (uint)nd < this->pcHeader->NUM_TAGS; nd._0_4_ = (uint)nd + 1) {
        paVar28 = (aiNode *)operator_new(0x478);
        aiNode::aiNode(paVar28);
        *(aiNode **)
         (*(long *)((long)&(pIOHandler_local->m_pathStack).
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[0x22].field_2 + 8) +
         (ulong)(uint)nd * 8) = paVar28;
        _m = paVar28;
        aiString::Set((aiString *)paVar28,(char *)local_160);
        _m->mParent = (aiNode *)
                      (pIOHandler_local->m_pathStack).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
        (_m->mTransformation).a4 = *(float *)(local_160 + 0x40);
        (_m->mTransformation).b4 = *(float *)(local_160 + 0x44);
        (_m->mTransformation).c4 = *(float *)(local_160 + 0x48);
        for (i_2 = 0; i_2 < 3; i_2 = i_2 + 1) {
          for (local_ff0 = 0; local_ff0 < 3; local_ff0 = local_ff0 + 1) {
            fVar2 = *(float *)(local_160 + (ulong)local_ff0 * 4 + (ulong)i_2 * 0xc + 0x4c);
            pfVar29 = aiMatrix4x4t<float>::operator[](&_m->mTransformation,local_ff0);
            pfVar29[i_2] = fVar2;
          }
        }
        local_160 = local_160 + 0x70;
      }
    }
    for (local_ff4 = 0;
        local_ff4 <
        *(uint *)&(pIOHandler_local->m_pathStack).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; local_ff4 = local_ff4 + 1) {
      *(uint *)((pIOHandler_local->m_pathStack).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[0x23]._M_string_length +
               (ulong)local_ff4 * 4) = local_ff4;
    }
    aiMatrix4x4t<float>::aiMatrix4x4t
              (&local_1034,1.0,0.0,0.0,0.0,0.0,0.0,1.0,0.0,0.0,-1.0,0.0,0.0,0.0,0.0,0.0,1.0);
    memcpy(&(pIOHandler_local->m_pathStack).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[0x20].field_0x4,&local_1034,0x40);
    Q3Shader::ShaderData::~ShaderData((ShaderData *)&header_name);
    Q3Shader::SkinData::~SkinData
              ((SkinData *)
               &shaders.blocks.
                super__List_base<Assimp::Q3Shader::ShaderDataBlock,_std::allocator<Assimp::Q3Shader::ShaderDataBlock>_>
                ._M_impl._M_node._M_size);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_148);
    std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::~unique_ptr
              (&local_98);
  }
  return;
}

Assistant:

void MD3Importer::InternReadFile( const std::string& pFile, aiScene* pScene, IOSystem* pIOHandler) {
    mFile = pFile;
    mScene = pScene;
    mIOHandler = pIOHandler;

    // get base path and file name
    // todo ... move to PathConverter
    std::string::size_type s = mFile.find_last_of("/\\");
    if (s == std::string::npos) {
        s = 0;
    } else {
        ++s;
    }
    filename = mFile.substr(s), path = mFile.substr(0, s);
    for (std::string::iterator it = filename.begin(); it != filename.end(); ++it) {
        *it = static_cast<char>( tolower(*it) );
    }

    // Load multi-part model file, if necessary
    if (configHandleMP) {
        if (ReadMultipartFile())
            return;
    }

    std::unique_ptr<IOStream> file( pIOHandler->Open( pFile));

    // Check whether we can read from the file
    if( file.get() == NULL)
        throw DeadlyImportError( "Failed to open MD3 file " + pFile + ".");

    // Check whether the md3 file is large enough to contain the header
    fileSize = (unsigned int)file->FileSize();
    if( fileSize < sizeof(MD3::Header))
        throw DeadlyImportError( "MD3 File is too small.");

    // Allocate storage and copy the contents of the file to a memory buffer
    std::vector<unsigned char> mBuffer2 (fileSize);
    file->Read( &mBuffer2[0], 1, fileSize);
    mBuffer = &mBuffer2[0];

    pcHeader = (BE_NCONST MD3::Header*)mBuffer;

    // Ensure correct endianness
#ifdef AI_BUILD_BIG_ENDIAN

    AI_SWAP4(pcHeader->VERSION);
    AI_SWAP4(pcHeader->FLAGS);
    AI_SWAP4(pcHeader->IDENT);
    AI_SWAP4(pcHeader->NUM_FRAMES);
    AI_SWAP4(pcHeader->NUM_SKINS);
    AI_SWAP4(pcHeader->NUM_SURFACES);
    AI_SWAP4(pcHeader->NUM_TAGS);
    AI_SWAP4(pcHeader->OFS_EOF);
    AI_SWAP4(pcHeader->OFS_FRAMES);
    AI_SWAP4(pcHeader->OFS_SURFACES);
    AI_SWAP4(pcHeader->OFS_TAGS);

#endif

    // Validate the file header
    ValidateHeaderOffsets();

    // Navigate to the list of surfaces
    BE_NCONST MD3::Surface* pcSurfaces = (BE_NCONST MD3::Surface*)(mBuffer + pcHeader->OFS_SURFACES);

    // Navigate to the list of tags
    BE_NCONST MD3::Tag* pcTags = (BE_NCONST MD3::Tag*)(mBuffer + pcHeader->OFS_TAGS);

    // Allocate output storage
    pScene->mNumMeshes = pcHeader->NUM_SURFACES;
    if (pcHeader->NUM_SURFACES == 0) {
        throw DeadlyImportError("MD3: No surfaces");
    } else if (pcHeader->NUM_SURFACES > AI_MAX_ALLOC(aiMesh)) {
        // We allocate pointers but check against the size of aiMesh
        // since those pointers will eventually have to point to real objects
        throw DeadlyImportError("MD3: Too many surfaces, would run out of memory");
    }
    pScene->mMeshes = new aiMesh*[pScene->mNumMeshes];

    pScene->mNumMaterials = pcHeader->NUM_SURFACES;
    pScene->mMaterials = new aiMaterial*[pScene->mNumMeshes];

    // Set arrays to zero to ensue proper destruction if an exception is raised
    ::memset(pScene->mMeshes,0,pScene->mNumMeshes*sizeof(aiMesh*));
    ::memset(pScene->mMaterials,0,pScene->mNumMaterials*sizeof(aiMaterial*));

    // Now read possible skins from .skin file
    Q3Shader::SkinData skins;
    ReadSkin(skins);

    // And check whether we can locate a shader file for this model
    Q3Shader::ShaderData shaders;
    ReadShader(shaders);

    // Adjust all texture paths in the shader
    const char* header_name = pcHeader->NAME;
    if (!shaders.blocks.empty()) {
        for (std::list< Q3Shader::ShaderDataBlock >::iterator dit = shaders.blocks.begin(); dit != shaders.blocks.end(); ++dit) {
            ConvertPath((*dit).name.c_str(),header_name,(*dit).name);

            for (std::list< Q3Shader::ShaderMapBlock >::iterator mit = (*dit).maps.begin(); mit != (*dit).maps.end(); ++mit) {
                ConvertPath((*mit).name.c_str(),header_name,(*mit).name);
            }
        }
    }

    // Read all surfaces from the file
    unsigned int iNum = pcHeader->NUM_SURFACES;
    unsigned int iNumMaterials = 0;
    while (iNum-- > 0)  {

        // Ensure correct endianness
#ifdef AI_BUILD_BIG_ENDIAN

        AI_SWAP4(pcSurfaces->FLAGS);
        AI_SWAP4(pcSurfaces->IDENT);
        AI_SWAP4(pcSurfaces->NUM_FRAMES);
        AI_SWAP4(pcSurfaces->NUM_SHADER);
        AI_SWAP4(pcSurfaces->NUM_TRIANGLES);
        AI_SWAP4(pcSurfaces->NUM_VERTICES);
        AI_SWAP4(pcSurfaces->OFS_END);
        AI_SWAP4(pcSurfaces->OFS_SHADERS);
        AI_SWAP4(pcSurfaces->OFS_ST);
        AI_SWAP4(pcSurfaces->OFS_TRIANGLES);
        AI_SWAP4(pcSurfaces->OFS_XYZNORMAL);

#endif

        // Validate the surface header
        ValidateSurfaceHeaderOffsets(pcSurfaces);

        // Navigate to the vertex list of the surface
        BE_NCONST MD3::Vertex* pcVertices = (BE_NCONST MD3::Vertex*)
            (((uint8_t*)pcSurfaces) + pcSurfaces->OFS_XYZNORMAL);

        // Navigate to the triangle list of the surface
        BE_NCONST MD3::Triangle* pcTriangles = (BE_NCONST MD3::Triangle*)
            (((uint8_t*)pcSurfaces) + pcSurfaces->OFS_TRIANGLES);

        // Navigate to the texture coordinate list of the surface
        BE_NCONST MD3::TexCoord* pcUVs = (BE_NCONST MD3::TexCoord*)
            (((uint8_t*)pcSurfaces) + pcSurfaces->OFS_ST);

        // Navigate to the shader list of the surface
        BE_NCONST MD3::Shader* pcShaders = (BE_NCONST MD3::Shader*)
            (((uint8_t*)pcSurfaces) + pcSurfaces->OFS_SHADERS);

        // If the submesh is empty ignore it
        if (0 == pcSurfaces->NUM_VERTICES || 0 == pcSurfaces->NUM_TRIANGLES)
        {
            pcSurfaces = (BE_NCONST MD3::Surface*)(((uint8_t*)pcSurfaces) + pcSurfaces->OFS_END);
            pScene->mNumMeshes--;
            continue;
        }

        // Allocate output mesh
        pScene->mMeshes[iNum] = new aiMesh();
        aiMesh* pcMesh = pScene->mMeshes[iNum];

        std::string _texture_name;
        const char* texture_name = NULL;

        // Check whether we have a texture record for this surface in the .skin file
        std::list< Q3Shader::SkinData::TextureEntry >::iterator it = std::find(
            skins.textures.begin(), skins.textures.end(), pcSurfaces->NAME );

        if (it != skins.textures.end()) {
            texture_name = &*( _texture_name = (*it).second).begin();
            ASSIMP_LOG_DEBUG_F("MD3: Assigning skin texture ", (*it).second, " to surface ", pcSurfaces->NAME);
            (*it).resolved = true; // mark entry as resolved
        }

        // Get the first shader (= texture?) assigned to the surface
        if (!texture_name && pcSurfaces->NUM_SHADER)    {
            texture_name = pcShaders->NAME;
        }

        std::string convertedPath;
        if (texture_name) {
            ConvertPath(texture_name,header_name,convertedPath);
        }

        const Q3Shader::ShaderDataBlock* shader = NULL;

        // Now search the current shader for a record with this name (
        // excluding texture file extension)
        if (!shaders.blocks.empty()) {
            std::string::size_type sh = convertedPath.find_last_of('.');
            if (sh == std::string::npos) {
                sh = convertedPath.length();
            }

            const std::string without_ext = convertedPath.substr(0,sh);
            std::list< Q3Shader::ShaderDataBlock >::const_iterator dit = std::find(shaders.blocks.begin(),shaders.blocks.end(),without_ext);
            if (dit != shaders.blocks.end()) {
                // We made it!
                shader = &*dit;
                ASSIMP_LOG_INFO("Found shader record for " +without_ext );
            } else {
                ASSIMP_LOG_WARN("Unable to find shader record for " + without_ext);
            }
        }

        aiMaterial* pcHelper = new aiMaterial();

        const int iMode = (int)aiShadingMode_Gouraud;
        pcHelper->AddProperty<int>(&iMode, 1, AI_MATKEY_SHADING_MODEL);

        // Add a small ambient color value - Quake 3 seems to have one
        aiColor3D clr;
        clr.b = clr.g = clr.r = 0.05f;
        pcHelper->AddProperty<aiColor3D>(&clr, 1,AI_MATKEY_COLOR_AMBIENT);

        clr.b = clr.g = clr.r = 1.0f;
        pcHelper->AddProperty<aiColor3D>(&clr, 1,AI_MATKEY_COLOR_DIFFUSE);
        pcHelper->AddProperty<aiColor3D>(&clr, 1,AI_MATKEY_COLOR_SPECULAR);

        // use surface name + skin_name as material name
        aiString name;
        name.Set("MD3_[" + configSkinFile + "][" + pcSurfaces->NAME + "]");
        pcHelper->AddProperty(&name,AI_MATKEY_NAME);

        if (!shader) {
            // Setup dummy texture file name to ensure UV coordinates are kept during postprocessing
            aiString szString;
            if (convertedPath.length()) {
                szString.Set(convertedPath);
            } else    {
                ASSIMP_LOG_WARN("Texture file name has zero length. Using default name");
                szString.Set("dummy_texture.bmp");
            }
            pcHelper->AddProperty(&szString,AI_MATKEY_TEXTURE_DIFFUSE(0));

            // prevent transparency by default
            int no_alpha = aiTextureFlags_IgnoreAlpha;
            pcHelper->AddProperty(&no_alpha,1,AI_MATKEY_TEXFLAGS_DIFFUSE(0));
        } else {
            Q3Shader::ConvertShaderToMaterial(pcHelper,*shader);
        }

        pScene->mMaterials[iNumMaterials] = (aiMaterial*)pcHelper;
        pcMesh->mMaterialIndex = iNumMaterials++;

            // Ensure correct endianness
#ifdef AI_BUILD_BIG_ENDIAN

        for (uint32_t i = 0; i < pcSurfaces->NUM_VERTICES;++i)  {
            AI_SWAP2( pcVertices[i].NORMAL );
            AI_SWAP2( pcVertices[i].X );
            AI_SWAP2( pcVertices[i].Y );
            AI_SWAP2( pcVertices[i].Z );

            AI_SWAP4( pcUVs[i].U );
            AI_SWAP4( pcUVs[i].U );
        }
        for (uint32_t i = 0; i < pcSurfaces->NUM_TRIANGLES;++i) {
            AI_SWAP4(pcTriangles[i].INDEXES[0]);
            AI_SWAP4(pcTriangles[i].INDEXES[1]);
            AI_SWAP4(pcTriangles[i].INDEXES[2]);
        }

#endif

        // Fill mesh information
        pcMesh->mPrimitiveTypes = aiPrimitiveType_TRIANGLE;

        pcMesh->mNumVertices        = pcSurfaces->NUM_TRIANGLES*3;
        pcMesh->mNumFaces           = pcSurfaces->NUM_TRIANGLES;
        pcMesh->mFaces              = new aiFace[pcSurfaces->NUM_TRIANGLES];
        pcMesh->mNormals            = new aiVector3D[pcMesh->mNumVertices];
        pcMesh->mVertices           = new aiVector3D[pcMesh->mNumVertices];
        pcMesh->mTextureCoords[0]   = new aiVector3D[pcMesh->mNumVertices];
        pcMesh->mNumUVComponents[0] = 2;

        // Fill in all triangles
        unsigned int iCurrent = 0;
        for (unsigned int i = 0; i < (unsigned int)pcSurfaces->NUM_TRIANGLES;++i)   {
            pcMesh->mFaces[i].mIndices = new unsigned int[3];
            pcMesh->mFaces[i].mNumIndices = 3;

            //unsigned int iTemp = iCurrent;
            for (unsigned int c = 0; c < 3;++c,++iCurrent)  {
                pcMesh->mFaces[i].mIndices[c] = iCurrent;

                // Read vertices
                aiVector3D& vec = pcMesh->mVertices[iCurrent];
                uint32_t index = pcTriangles->INDEXES[c];
                if (index >= pcSurfaces->NUM_VERTICES) {
                    throw DeadlyImportError( "MD3: Invalid vertex index");
                }
                vec.x = pcVertices[index].X*AI_MD3_XYZ_SCALE;
                vec.y = pcVertices[index].Y*AI_MD3_XYZ_SCALE;
                vec.z = pcVertices[index].Z*AI_MD3_XYZ_SCALE;

                // Convert the normal vector to uncompressed float3 format
                aiVector3D& nor = pcMesh->mNormals[iCurrent];
                LatLngNormalToVec3(pcVertices[index].NORMAL,(ai_real*)&nor);

                // Read texture coordinates
                pcMesh->mTextureCoords[0][iCurrent].x = pcUVs[index].U;
                pcMesh->mTextureCoords[0][iCurrent].y = 1.0f-pcUVs[index].V;
            }
            // Flip face order if necessary
            if (!shader || shader->cull == Q3Shader::CULL_CW) {
                std::swap(pcMesh->mFaces[i].mIndices[2],pcMesh->mFaces[i].mIndices[1]);
            }
            ++pcTriangles;
        }

        // Go to the next surface
        pcSurfaces = (BE_NCONST MD3::Surface*)(((unsigned char*)pcSurfaces) + pcSurfaces->OFS_END);
    }

    // For debugging purposes: check whether we found matches for all entries in the skins file
    if (!DefaultLogger::isNullLogger()) {
        for (std::list< Q3Shader::SkinData::TextureEntry>::const_iterator it = skins.textures.begin();it != skins.textures.end(); ++it) {
            if (!(*it).resolved) {
                ASSIMP_LOG_ERROR_F("MD3: Failed to match skin ", (*it).first, " to surface ", (*it).second);
            }
        }
    }

    if (!pScene->mNumMeshes) {
        throw DeadlyImportError( "MD3: File contains no valid mesh");
    }
    pScene->mNumMaterials = iNumMaterials;

    // Now we need to generate an empty node graph
    pScene->mRootNode = new aiNode("<MD3Root>");
    pScene->mRootNode->mNumMeshes = pScene->mNumMeshes;
    pScene->mRootNode->mMeshes = new unsigned int[pScene->mNumMeshes];

    // Attach tiny children for all tags
    if (pcHeader->NUM_TAGS) {
        pScene->mRootNode->mNumChildren = pcHeader->NUM_TAGS;
        pScene->mRootNode->mChildren = new aiNode*[pcHeader->NUM_TAGS];

        for (unsigned int i = 0; i < pcHeader->NUM_TAGS; ++i, ++pcTags) {
            aiNode* nd = pScene->mRootNode->mChildren[i] = new aiNode();
            nd->mName.Set((const char*)pcTags->NAME);
            nd->mParent = pScene->mRootNode;

            AI_SWAP4(pcTags->origin.x);
            AI_SWAP4(pcTags->origin.y);
            AI_SWAP4(pcTags->origin.z);

            // Copy local origin, again flip z,y
            nd->mTransformation.a4 = pcTags->origin.x;
            nd->mTransformation.b4 = pcTags->origin.y;
            nd->mTransformation.c4 = pcTags->origin.z;

            // Copy rest of transformation (need to transpose to match row-order matrix)
            for (unsigned int a = 0; a < 3;++a) {
                for (unsigned int m = 0; m < 3;++m) {
                    nd->mTransformation[m][a] = pcTags->orientation[a][m];
                    AI_SWAP4(nd->mTransformation[m][a]);
                }
            }
        }
    }

    for (unsigned int i = 0; i < pScene->mNumMeshes;++i)
        pScene->mRootNode->mMeshes[i] = i;

    // Now rotate the whole scene 90 degrees around the x axis to convert to internal coordinate system
    pScene->mRootNode->mTransformation = aiMatrix4x4(
        1.f,0.f,0.f,0.f,
        0.f,0.f,1.f,0.f,
        0.f,-1.f,0.f,0.f,
        0.f,0.f,0.f,1.f
    );
}